

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int unixRead(unqlite_file *id,void *pBuf,unqlite_int64 amt,unqlite_int64 offset)

{
  uint uVar1;
  __off_t _Var2;
  ssize_t sVar3;
  int *piVar4;
  undefined1 *puVar5;
  undefined1 *puVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  
  iVar7 = 0;
  _Var2 = lseek(*(int *)&id[2].pMethods,offset,0);
  uVar9 = (uint)amt;
  if (_Var2 == offset) {
    sVar3 = read(*(int *)&id[2].pMethods,pBuf,(long)(int)uVar9);
    uVar8 = (uint)sVar3;
    uVar1 = uVar8;
    if (-1 < (int)uVar8) goto LAB_0010fbbb;
LAB_0010fbb0:
    uVar8 = uVar1;
    piVar4 = __errno_location();
    iVar7 = *piVar4;
  }
  else {
    uVar8 = 0xffffffff;
    uVar1 = 0xffffffff;
    if (_Var2 == -1) goto LAB_0010fbb0;
  }
  *(int *)((long)&id[3].pMethods + 4) = iVar7;
LAB_0010fbbb:
  iVar7 = 0;
  if (((uVar9 - uVar8 != 0) && (iVar7 = -2, -1 < (int)uVar8)) &&
     (*(undefined4 *)((long)&id[3].pMethods + 4) = 0, uVar9 != uVar8)) {
    puVar6 = (undefined1 *)((long)pBuf + (ulong)uVar8);
    puVar5 = puVar6 + (uVar9 - uVar8);
    do {
      *puVar6 = 0;
      if (puVar5 <= puVar6 + 1) {
        return -2;
      }
      puVar6[1] = 0;
      if (puVar5 <= puVar6 + 2) {
        return -2;
      }
      puVar6[2] = 0;
      if (puVar5 <= puVar6 + 3) {
        return -2;
      }
      puVar6[3] = 0;
      puVar6 = puVar6 + 4;
    } while (puVar6 < puVar5);
  }
  return iVar7;
}

Assistant:

static int unixRead(
  unqlite_file *id, 
  void *pBuf, 
  unqlite_int64 amt,
  unqlite_int64 offset
){
  unixFile *pFile = (unixFile *)id;
  int got;
  
  got = seekAndRead(pFile, offset, pBuf, (int)amt);
  if( got==(int)amt ){
    return UNQLITE_OK;
  }else if( got<0 ){
    /* lastErrno set by seekAndRead */
    return UNQLITE_IOERR;
  }else{
    pFile->lastErrno = 0; /* not a system error */
    /* Unread parts of the buffer must be zero-filled */
    SyZero(&((char*)pBuf)[got],(sxu32)amt-got);
    return UNQLITE_IOERR;
  }
}